

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_file_reader.cc
# Opt level: O2

size_t __thiscall draco::StdioFileReader::GetFileSize(StdioFileReader *this)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = fseek((FILE *)this->file_,0,2);
  if (iVar1 == 0) {
    sVar2 = ftello64((FILE *)this->file_);
    rewind((FILE *)this->file_);
  }
  else {
    fprintf(_stderr,"%s:%d (%s): %s.\n",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]draco/src/draco/io/stdio_file_reader.cc"
            ,0x56,"GetFileSize","Seek to EoF failed");
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t StdioFileReader::GetFileSize() {
  if (fseek(file_, SEEK_SET, SEEK_END) != 0) {
    FILEREADER_LOG_ERROR("Seek to EoF failed");
    return false;
  }

#if _FILE_OFFSET_BITS == 64
  const size_t file_size = static_cast<size_t>(ftello(file_));
#elif defined _WIN64
  const size_t file_size = static_cast<size_t>(_ftelli64(file_));
#else
  const size_t file_size = static_cast<size_t>(ftell(file_));
#endif

  rewind(file_);

  return file_size;
}